

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

type __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Color>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  long lVar4;
  system_error *psVar5;
  long lVar6;
  char *__s2;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar8;
  long lVar9;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar10;
  string_view_type sVar11;
  pair<const_std::pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_std::pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  pVar12;
  error_code __ec;
  error_code __ec_00;
  string local_60;
  error_code local_40;
  
  bVar1 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::Color,_void>
          ::is(this);
  if (!bVar1) {
    psVar5 = (system_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(&local_40,conversion_failed);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60.field_2._M_allocated_capacity._0_7_ = 0x6e206120746f4e;
    local_60.field_2._7_4_ = 0x433a3a73;
    local_60.field_2._11_4_ = 0x726f6c6f;
    local_60._M_string_length = 0xf;
    local_60.field_2._M_local_buf[0xf] = '\0';
    __ec._4_4_ = 0;
    __ec._M_value = local_40._M_value;
    *(undefined ***)(psVar5 + 0x50) = &PTR__json_exception_00b2f248;
    __ec._M_cat = local_40._M_cat;
    std::system_error::system_error(psVar5,__ec,&local_60);
    *(undefined8 *)psVar5 = 0xb31b78;
    *(undefined8 *)(psVar5 + 0x50) = 0xb31bb0;
    *(undefined8 *)(psVar5 + 0x20) = 0;
    *(undefined8 *)(psVar5 + 0x28) = 0;
    *(system_error **)(psVar5 + 0x30) = psVar5 + 0x40;
    *(undefined8 *)(psVar5 + 0x38) = 0;
    psVar5[0x40] = (system_error)0x0;
    __cxa_throw(psVar5,&conv_error::typeinfo,conv_error::~conv_error);
  }
  sVar11 = as_string_view(this);
  __s2 = sVar11._M_str;
  sVar11 = as_string_view(this);
  __n = sVar11._M_len;
  pVar12 = json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>
           ::get_values_abi_cxx11_();
  ppVar3 = pVar12.first;
  pVar12 = json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>
           ::get_values_abi_cxx11_();
  ppVar7 = pVar12.second;
  lVar6 = (long)ppVar7 - (long)ppVar3;
  lVar9 = (lVar6 >> 3) * -0x3333333333333333 >> 2;
  if (__n == 0) {
    ppVar8 = ppVar3;
    lVar4 = lVar6;
    if (0 < lVar9) {
      ppVar8 = ppVar3 + lVar9 * 4;
      lVar4 = lVar9 + 1;
      ppVar10 = ppVar3 + 2;
      do {
        if (ppVar10[-2].first == yellow) {
          ppVar10 = ppVar10 + -2;
          goto LAB_00757425;
        }
        if (ppVar10[-1].first == yellow) {
          ppVar10 = ppVar10 + -1;
          goto LAB_00757425;
        }
        if (ppVar10->first == yellow) goto LAB_00757425;
        if (ppVar10[1].first == yellow) {
          ppVar10 = ppVar10 + 1;
          goto LAB_00757425;
        }
        lVar4 = lVar4 + -1;
        ppVar10 = ppVar10 + 4;
      } while (1 < lVar4);
      lVar4 = (long)ppVar7 - (long)ppVar8;
    }
    lVar4 = (lVar4 >> 3) * -0x3333333333333333;
    if (lVar4 == 1) {
LAB_00757402:
      ppVar10 = ppVar8;
      if (ppVar8->first != yellow) {
        return yellow;
      }
    }
    else if (lVar4 == 2) {
LAB_007573f9:
      ppVar10 = ppVar8;
      if (ppVar8->first != yellow) {
        ppVar8 = ppVar8 + 1;
        goto LAB_00757402;
      }
    }
    else {
      if (lVar4 != 3) {
        return yellow;
      }
      ppVar10 = ppVar8;
      if (ppVar8->first != yellow) {
        ppVar8 = ppVar8 + 1;
        goto LAB_007573f9;
      }
    }
LAB_00757425:
    if (ppVar10 == ppVar7) {
      return yellow;
    }
  }
  ppVar8 = ppVar3;
  if (0 < lVar9) {
    ppVar8 = ppVar3 + lVar9 * 4;
    lVar9 = lVar9 + 1;
    ppVar3 = ppVar3 + 2;
    do {
      if (ppVar3[-2].second._M_string_length == __n) {
        if ((__n == 0) || (iVar2 = bcmp(ppVar3[-2].second._M_dataplus._M_p,__s2,__n), iVar2 == 0)) {
          ppVar3 = ppVar3 + -2;
          goto LAB_007575b4;
        }
        if (ppVar3[-1].second._M_string_length == __n) goto LAB_0075748d;
      }
      else if (ppVar3[-1].second._M_string_length == __n) {
        if (__n != 0) {
LAB_0075748d:
          iVar2 = bcmp(ppVar3[-1].second._M_dataplus._M_p,__s2,__n);
          if (iVar2 != 0) goto LAB_007574a4;
        }
        ppVar3 = ppVar3 + -1;
        goto LAB_007575b4;
      }
LAB_007574a4:
      if ((ppVar3->second)._M_string_length == __n) {
        if ((__n == 0) || (iVar2 = bcmp((ppVar3->second)._M_dataplus._M_p,__s2,__n), iVar2 == 0))
        goto LAB_007575b4;
        if (ppVar3[1].second._M_string_length == __n) {
LAB_007574e1:
          iVar2 = bcmp(ppVar3[1].second._M_dataplus._M_p,__s2,__n);
          if (iVar2 == 0) goto LAB_007575b0;
        }
      }
      else if (ppVar3[1].second._M_string_length == __n) {
        if (__n != 0) goto LAB_007574e1;
LAB_007575b0:
        ppVar3 = ppVar3 + 1;
        goto LAB_007575b4;
      }
      lVar9 = lVar9 + -1;
      ppVar3 = ppVar3 + 4;
    } while (1 < lVar9);
    lVar6 = (long)ppVar7 - (long)ppVar8;
  }
  lVar6 = (lVar6 >> 3) * -0x3333333333333333;
  ppVar3 = ppVar8;
  if (lVar6 == 1) {
LAB_00757581:
    if ((ppVar3->second)._M_string_length == __n) {
      if ((__n != 0) && (iVar2 = bcmp((ppVar3->second)._M_dataplus._M_p,__s2,__n), iVar2 != 0))
      goto LAB_0075769a;
      goto LAB_007575b4;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_0075755f:
      if (((ppVar8->second)._M_string_length != __n) ||
         ((ppVar3 = ppVar8, __n != 0 &&
          (iVar2 = bcmp((ppVar8->second)._M_dataplus._M_p,__s2,__n), iVar2 != 0)))) {
        ppVar3 = ppVar8 + 1;
        goto LAB_00757581;
      }
    }
    else {
      if (lVar6 != 3) goto LAB_007575be;
      if (((ppVar8->second)._M_string_length != __n) ||
         ((__n != 0 && (iVar2 = bcmp((ppVar8->second)._M_dataplus._M_p,__s2,__n), iVar2 != 0)))) {
        ppVar8 = ppVar8 + 1;
        goto LAB_0075755f;
      }
    }
LAB_007575b4:
    if (ppVar3 != ppVar7) {
      return ppVar3->first;
    }
  }
LAB_007575be:
  if (__n == 0) {
    return yellow;
  }
LAB_0075769a:
  psVar5 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_40,conversion_failed);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60.field_2._M_allocated_capacity._0_7_ = 0x206e6120746f4e;
  local_60.field_2._7_4_ = 0x6d756e65;
  local_60._M_string_length = 0xb;
  local_60.field_2._11_4_ = local_60.field_2._11_4_ & 0xffffff00;
  __ec_00._4_4_ = 0;
  __ec_00._M_value = local_40._M_value;
  *(undefined ***)(psVar5 + 0x50) = &PTR__json_exception_00b2f248;
  __ec_00._M_cat = local_40._M_cat;
  std::system_error::system_error(psVar5,__ec_00,&local_60);
  *(undefined8 *)psVar5 = 0xb31b78;
  *(undefined8 *)(psVar5 + 0x50) = 0xb31bb0;
  *(undefined8 *)(psVar5 + 0x20) = 0;
  *(undefined8 *)(psVar5 + 0x28) = 0;
  *(system_error **)(psVar5 + 0x30) = psVar5 + 0x40;
  *(undefined8 *)(psVar5 + 0x38) = 0;
  psVar5[0x40] = (system_error)0x0;
  __cxa_throw(psVar5,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }